

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::BuilderTest_build_histogram_Test::TestBody
          (BuilderTest_build_histogram_Test *this)

{
  Builder<prometheus::Histogram> *pBVar1;
  Family<prometheus::Histogram> *this_00;
  initializer_list<double> __l;
  allocator_type local_99;
  void *local_98 [6];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  double local_28 [3];
  
  BuildHistogram();
  pBVar1 = detail::Builder<prometheus::Histogram>::Name
                     ((Builder<prometheus::Histogram> *)local_98,&(this->super_BuilderTest).name);
  pBVar1 = detail::Builder<prometheus::Histogram>::Help(pBVar1,&(this->super_BuilderTest).help);
  pBVar1 = detail::Builder<prometheus::Histogram>::Labels
                     (pBVar1,&(this->super_BuilderTest).const_labels);
  this_00 = detail::Builder<prometheus::Histogram>::Register
                      (pBVar1,&(this->super_BuilderTest).registry);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&((Builder<prometheus::Histogram> *)local_98)->help_ + 0x10U)) {
    operator_delete(local_48._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&((Builder<prometheus::Histogram> *)local_98)->name_ + 0x10U)) {
    operator_delete(local_68._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_98);
  local_28[0] = 1.0;
  local_28[1] = 2.0;
  __l._M_len = 2;
  __l._M_array = local_28;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_98,__l,&local_99);
  Family<prometheus::Histogram>::Add<std::vector<double,std::allocator<double>>>
            (this_00,&(this->super_BuilderTest).more_labels,
             (vector<double,_std::allocator<double>_> *)local_98);
  if (local_98[0] != (void *)0x0) {
    operator_delete(local_98[0]);
  }
  BuilderTest::verifyCollectedLabels(&this->super_BuilderTest);
  return;
}

Assistant:

TEST_F(BuilderTest, build_histogram) {
  auto& family = BuildHistogram()
                     .Name(name)
                     .Help(help)
                     .Labels(const_labels)
                     .Register(registry);
  family.Add(more_labels, Histogram::BucketBoundaries{1, 2});

  verifyCollectedLabels();
}